

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall
CVmObjStringBuffer::splice_text
          (CVmObjStringBuffer *this,vm_obj_id_t self,int32_t idx,int32_t del_chars,char *src,
          int32_t ins_bytes,int undo)

{
  undefined4 uVar1;
  size_t sVar2;
  vm_obj_id_t in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CVmObjStringBuffer *in_RDI;
  CVmObjStringBuffer *in_R8;
  int32_t in_R9D;
  int in_stack_00000008;
  int32_t ins_chars;
  utf8_ptr p;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  strbuf_undo_action in_stack_ffffffffffffffe8;
  
  utf8_ptr::utf8_ptr((utf8_ptr *)in_RDI,in_stack_ffffffffffffffb8);
  sVar2 = utf8_ptr::len((utf8_ptr *)in_RDI,(size_t)in_stack_ffffffffffffffb8);
  uVar1 = (undefined4)sVar2;
  adjust_args(in_R8,(int32_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
              (int32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  if (in_stack_00000008 != 0) {
    add_undo_rec((CVmObjStringBuffer *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
                 (int32_t)((ulong)in_R8 >> 0x20),(int32_t)in_R8,in_R9D);
  }
  splice_move((CVmObjStringBuffer *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
              (int32_t)((ulong)in_R8 >> 0x20));
  get_ext(in_RDI);
  utf8_ptr::to_wchar((wchar_t *)in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                     (char *)in_stack_ffffffffffffffd0,CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void CVmObjStringBuffer::splice_text(VMG_ vm_obj_id_t self,
                                     int32_t idx, int32_t del_chars,
                                     const char *src, int32_t ins_bytes,
                                     int undo)
{
    /* figure the character length of the string */
    utf8_ptr p((char *)src);
    int32_t ins_chars = p.len(ins_bytes);

    /* check arguments */
    adjust_args(&idx, &del_chars, &ins_chars);

    /* if desired, save undo */
    if (undo)
        add_undo_rec(vmg_ self, STRBUF_UNDO_REPL, idx, del_chars, ins_chars);

    /* open up a gap in the buffer */
    splice_move(vmg_ idx, del_chars, ins_chars);

    /* decode characters into the buffer */
    p.to_wchar(get_ext()->buf + idx, ins_chars, src, ins_bytes);
}